

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void TPZSkylMatrix<std::complex<double>_>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<std::complex<double>_> *storage,
               TPZVec<std::complex<double>_*> *point)

{
  long lVar1;
  int64_t from;
  int64_t numelem;
  complex<double> *pcVar2;
  complex<double> **ppcVar3;
  long *plVar4;
  TPZVec<std::complex<double>_*> *in_RDX;
  TPZVec<std::complex<double>_> *in_RSI;
  TPZVec<long> *in_RDI;
  int64_t i;
  int64_t nel;
  int64_t dim;
  TPZVec<long> *in_stack_ffffffffffffffb0;
  long local_40;
  complex<double> local_38;
  
  from = TPZVec<long>::NElements(in_RDI);
  numelem = NumElements(in_stack_ffffffffffffffb0);
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,numelem);
  std::complex<double>::complex(&local_38,0.0,0.0);
  TPZVec<std::complex<double>_>::Fill(in_RSI,(complex<double> *)in_RDX,from,numelem);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,from + 1);
  if (from == 0) {
    ppcVar3 = TPZVec<std::complex<double>_*>::operator[](in_RDX,0);
    *ppcVar3 = (complex<double> *)0x0;
  }
  else {
    pcVar2 = TPZVec<std::complex<double>_>::operator[](in_RSI,0);
    ppcVar3 = TPZVec<std::complex<double>_*>::operator[](in_RDX,0);
    *ppcVar3 = pcVar2;
    pcVar2 = TPZVec<std::complex<double>_>::operator[](in_RSI,0);
    pcVar2 = pcVar2 + numelem;
    ppcVar3 = TPZVec<std::complex<double>_*>::operator[](in_RDX,from);
    *ppcVar3 = pcVar2;
  }
  for (local_40 = 1; local_40 < from + 1; local_40 = local_40 + 1) {
    ppcVar3 = TPZVec<std::complex<double>_*>::operator[](in_RDX,local_40 + -1);
    pcVar2 = *ppcVar3;
    plVar4 = TPZVec<long>::operator[](in_RDI,local_40 + -1);
    lVar1 = *plVar4;
    ppcVar3 = TPZVec<std::complex<double>_*>::operator[](in_RDX,local_40);
    *ppcVar3 = pcVar2 + (local_40 - lVar1);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}